

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  long lVar2;
  ostream *poVar3;
  pointer pMVar4;
  char *pcVar5;
  pointer pMVar6;
  string local_a0;
  string local_80;
  ReusableStringStream msg;
  string local_50;
  
  if ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0))
  goto LAB_001b6f18;
  ReusableStringStream::ReusableStringStream(&msg);
  poVar3 = msg.m_oss;
  if (this->m_headerPrintedForThisSection == false) {
    printSectionHeader(this,msg.m_oss);
  }
  this->m_headerPrintedForThisSection = true;
  local_a0._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_a0._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  Catch::operator<<(poVar3,(SourceLineInfo *)&local_a0);
  std::operator<<(poVar3,'\n');
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar1 == ExpressionFailed) {
    pcVar5 = "expression failed";
LAB_001b6c43:
    std::operator<<(poVar3,pcVar5);
  }
  else {
    if (OVar1 == ExplicitFailure) {
      pcVar5 = "explicit failure";
      goto LAB_001b6c43;
    }
    if (OVar1 == ThrewException) {
      pcVar5 = "unexpected exception";
      goto LAB_001b6c43;
    }
    if (OVar1 == DidntThrowException) {
      pcVar5 = "no exception was thrown where one was expected";
      goto LAB_001b6c43;
    }
    if (OVar1 == FatalErrorCondition) {
      pcVar5 = "fatal error condition";
      goto LAB_001b6c43;
    }
    if ((uint)OVar1 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_80);
      std::operator<<((ostream *)local_80._M_string_length,"Internal error in TeamCity reporter");
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a0);
    }
    if (((OVar1 == Unknown) || (OVar1 == FailureBit)) || (OVar1 == Exception)) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_80);
      std::operator<<((ostream *)local_80._M_string_length,"Not implemented");
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a0);
    }
  }
  pMVar6 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pMVar4 - (long)pMVar6;
  if (lVar2 == 0x48) {
    std::operator<<(poVar3," with message:");
    pMVar6 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar2 = (long)pMVar4 - (long)pMVar6;
  }
  if (1 < (ulong)(lVar2 / 0x48)) {
    std::operator<<(poVar3," with messages:");
    pMVar6 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pMVar6 != pMVar4; pMVar6 = pMVar6 + 1) {
    std::operator<<(poVar3,"\n  \"");
    std::operator<<(poVar3,(string *)&pMVar6->message);
    poVar3 = msg.m_oss;
    std::operator<<(msg.m_oss,'\"');
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::operator<<(poVar3,"\n  ");
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a0,&assertionStats->assertionResult);
    std::operator<<(poVar3,(string *)&local_a0);
    std::operator<<(poVar3,"\nwith expansion:\n  ");
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_80,&assertionStats->assertionResult);
    std::operator<<(poVar3,(string *)&local_80);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((((this->super_StreamingReporterBase).currentTestCaseInfo)->properties & (MayFail|ShouldFail))
      == None) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"##teamcity[testFailed");
    poVar3 = std::operator<<(poVar3," name=\'");
    anon_unknown_23::escape
              (&local_a0,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    poVar3 = std::operator<<(poVar3,'\'');
    poVar3 = std::operator<<(poVar3," message=\'");
    std::__cxx11::stringbuf::str();
    anon_unknown_23::escape(&local_80,&local_50);
    poVar3 = std::operator<<(poVar3,(string *)&local_80);
    poVar3 = std::operator<<(poVar3,'\'');
    std::operator<<(poVar3,"]\n");
  }
  else {
    std::operator<<(msg.m_oss,"- failure ignore as test marked as \'ok to fail\'\n");
    poVar3 = std::operator<<((this->super_StreamingReporterBase).stream,"##teamcity[testIgnored");
    poVar3 = std::operator<<(poVar3," name=\'");
    anon_unknown_23::escape
              (&local_a0,&((this->super_StreamingReporterBase).currentTestCaseInfo)->name);
    poVar3 = std::operator<<(poVar3,(string *)&local_a0);
    poVar3 = std::operator<<(poVar3,'\'');
    poVar3 = std::operator<<(poVar3," message=\'");
    std::__cxx11::stringbuf::str();
    anon_unknown_23::escape(&local_80,&local_50);
    poVar3 = std::operator<<(poVar3,(string *)&local_80);
    poVar3 = std::operator<<(poVar3,'\'');
    std::operator<<(poVar3,"]\n");
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a0);
  ReusableStringStream::~ReusableStringStream(&msg);
LAB_001b6f18:
  std::ostream::flush();
  return true;
}

Assistant:

bool TeamCityReporter::assertionEnded(AssertionStats const &assertionStats) {
        AssertionResult const &result = assertionStats.assertionResult;
        if (!result.isOk()) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const &messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if (currentTestCaseInfo->okToFail()) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                stream << "##teamcity[testIgnored"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
            else {
                stream << "##teamcity[testFailed"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
        }
        stream.flush();
        return true;
    }